

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O1

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::PhysicalTableScan::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PhysicalTableScan *this)

{
  table_function_to_string_t p_Var1;
  pointer pCVar2;
  pointer pCVar3;
  ulong __n;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  vector<duckdb::ColumnIndex,_true> *pvVar6;
  vector<duckdb::ColumnIndex,_true> *pvVar7;
  undefined8 uVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  const_reference pvVar13;
  const_reference type;
  pointer pTVar14;
  __node_base_ptr p_Var15;
  pointer pTVar16;
  _Base_ptr p_Var17;
  pointer this_00;
  long *plVar18;
  string *psVar19;
  idx_t params;
  InternalException *this_01;
  TableFunction *pTVar20;
  undefined8 key;
  size_type __n_00;
  _Hash_node_base *p_Var21;
  value_type __n_01;
  ulong in_R8;
  __node_base_ptr p_Var22;
  _Rb_tree_header *p_Var23;
  TableFunctionToStringInput input;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  to_string_result;
  undefined1 local_120 [32];
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [8];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_a8;
  vector<duckdb::LogicalType,_true> *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_98;
  Exception local_90;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = (this->function).to_string;
  local_100 = __return_storage_ptr__;
  if (p_Var1 == (table_function_to_string_t)0x0) {
    StringUtil::Upper((string *)&local_f8,
                      &(this->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
                       super_Function.name);
    local_120._0_8_ = (TableFunction *)(local_120 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"Function","");
    pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](__return_storage_ptr__,(string *)local_120);
    ::std::__cxx11::string::operator=((string *)pbVar10,(string *)local_f8._M_local_buf);
    if ((TableFunction *)local_120._0_8_ != (TableFunction *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity);
    }
  }
  else {
    local_120._0_8_ = &this->function;
    local_120._8_8_ =
         (this->bind_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (*p_Var1)((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f8,(TableFunctionToStringInput *)local_120);
    uVar8 = local_f8._8_8_;
    for (key = local_f8._M_allocated_capacity; key != uVar8; key = key + 0x40) {
      pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[](__return_storage_ptr__,(string *)key);
      ::std::__cxx11::string::_M_assign((string *)pbVar10);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_e8 + 8));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_f8);
  }
  if ((this->function).projection_pushdown == true) {
    local_f8._M_allocated_capacity = (size_type)local_e8;
    local_f8._8_8_ = (string *)0x0;
    local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffffffffff00);
    bVar9 = (this->function).filter_prune;
    local_a8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&this->projection_ids;
    pvVar7 = (vector<duckdb::ColumnIndex,_true> *)&this->projection_ids;
    pvVar6 = (vector<duckdb::ColumnIndex,_true> *)local_a8;
    if (bVar9 == false) {
      pvVar6 = &this->column_ids;
      pvVar7 = &this->column_ids;
    }
    pCVar2 = (pvVar7->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar3 = (pvVar6->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pCVar2 != pCVar3) {
      local_98 = &this->names;
      local_a0 = &this->returned_types;
      __n_00 = 0;
      do {
        __n_01 = __n_00;
        if ((this->function).filter_prune == true) {
          pvVar11 = vector<unsigned_long,_true>::operator[]
                              ((vector<unsigned_long,_true> *)local_a8,__n_00);
          __n_01 = *pvVar11;
        }
        pvVar12 = vector<duckdb::ColumnIndex,_true>::operator[](&this->column_ids,__n_01);
        __n = pvVar12->index;
        if (__n < (ulong)((long)(this->names).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->names).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](local_98,__n);
          type = vector<duckdb::LogicalType,_true>::operator[](local_a0,__n);
          AddProjectionNames(pvVar12,pvVar13,type,(string *)&local_f8);
        }
        __n_00 = __n_00 + 1;
      } while ((long)pCVar2 - (long)pCVar3 >> ((bVar9 ^ 1U) * '\x02' + 3 & 0x3f) != __n_00);
    }
    local_120._0_8_ = (TableFunction *)(local_120 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"Projections","");
    __return_storage_ptr__ = local_100;
    pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](local_100,(string *)local_120);
    ::std::__cxx11::string::_M_assign((string *)pbVar10);
    if ((TableFunction *)local_120._0_8_ != (TableFunction *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity);
    }
  }
  if (((this->function).filter_pushdown == true) &&
     ((this->table_filters).
      super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
      .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl != (TableFilterSet *)0x0)
     ) {
    local_f8._M_allocated_capacity = (size_type)local_e8;
    local_f8._8_8_ = (string *)0x0;
    local_e8 = (undefined1  [8])((ulong)local_e8 & 0xffffffffffffff00);
    pTVar14 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              ::operator->(&this->table_filters);
    p_Var17 = (pTVar14->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var23 = &(pTVar14->filters)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var17 != p_Var23) {
      local_a8 = &this->names;
      bVar9 = true;
      do {
        if (*(ulong *)(p_Var17 + 1) <
            (ulong)((long)(this->names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->names).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          if (!bVar9) {
            ::std::__cxx11::string::append(local_f8._M_local_buf);
          }
          pvVar12 = vector<duckdb::ColumnIndex,_true>::operator[]
                              (&this->column_ids,*(size_type *)(p_Var17 + 1));
          p_Var21 = (_Hash_node_base *)pvVar12->index;
          bVar9 = IsVirtualColumn((column_t)p_Var21);
          if (bVar9) {
            in_R8 = (this->virtual_columns)._M_h._M_bucket_count;
            p_Var4 = (this->virtual_columns)._M_h._M_buckets[(ulong)p_Var21 % in_R8];
            p_Var15 = (__node_base_ptr)0x0;
            if ((p_Var4 != (__node_base_ptr)0x0) &&
               (p_Var15 = p_Var4, p_Var22 = p_Var4->_M_nxt, p_Var21 != p_Var4->_M_nxt[1]._M_nxt)) {
              while (p_Var5 = p_Var22->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
                p_Var15 = (__node_base_ptr)0x0;
                if (((ulong)p_Var5[1]._M_nxt % in_R8 != (ulong)p_Var21 % in_R8) ||
                   (p_Var15 = p_Var22, p_Var22 = p_Var5, p_Var21 == p_Var5[1]._M_nxt))
                goto LAB_01701e54;
              }
              p_Var15 = (__node_base_ptr)0x0;
            }
LAB_01701e54:
            if (p_Var15 == (__node_base_ptr)0x0) {
              p_Var21 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var21 = p_Var15->_M_nxt;
            }
            if (p_Var21 == (_Hash_node_base *)0x0) {
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              local_120._0_8_ = (TableFunction *)(local_120 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_120,"Virtual column not found","");
              InternalException::InternalException(this_01,(string *)local_120);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            pTVar16 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      ::operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                                    *)&p_Var17[1]._M_parent);
            (*pTVar16->_vptr_TableFilter[3])(local_120,pTVar16,p_Var21 + 2);
            ::std::__cxx11::string::_M_append(local_f8._M_local_buf,local_120._0_8_);
          }
          else {
            pTVar16 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      ::operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                                    *)&p_Var17[1]._M_parent);
            pvVar13 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](local_a8,(size_type)p_Var21);
            (*pTVar16->_vptr_TableFilter[3])(local_120,pTVar16,pvVar13);
            ::std::__cxx11::string::_M_append(local_f8._M_local_buf,local_120._0_8_);
          }
          if ((TableFunction *)local_120._0_8_ != (TableFunction *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_);
          }
          bVar9 = false;
        }
        p_Var17 = (_Base_ptr)::std::_Rb_tree_increment(p_Var17);
      } while ((_Rb_tree_header *)p_Var17 != p_Var23);
    }
    local_120._0_8_ = (TableFunction *)(local_120 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"Filters","");
    __return_storage_ptr__ = local_100;
    pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](local_100,(string *)local_120);
    ::std::__cxx11::string::_M_assign((string *)pbVar10);
    if ((TableFunction *)local_120._0_8_ != (TableFunction *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity);
    }
  }
  if ((this->extra_info).sample_options.
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0) {
    this_00 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
              operator->(&(this->extra_info).sample_options);
    Value::ToString_abi_cxx11_(&local_50,&this_00->sample_size);
    in_R8 = 8;
    plVar18 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1e268d9);
    pTVar20 = (TableFunction *)(plVar18 + 2);
    if ((TableFunction *)*plVar18 == pTVar20) {
      local_120._16_8_ =
           (pTVar20->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
           _vptr_Function;
      local_120._24_8_ = plVar18[3];
      local_120._0_8_ = (TableFunction *)(local_120 + 0x10);
    }
    else {
      local_120._16_8_ =
           (pTVar20->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
           _vptr_Function;
      local_120._0_8_ = (TableFunction *)*plVar18;
    }
    local_120._8_8_ = plVar18[1];
    *plVar18 = (long)pTVar20;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    plVar18 = (long *)::std::__cxx11::string::append(local_120);
    psVar19 = (string *)(plVar18 + 2);
    if ((string *)*plVar18 == psVar19) {
      local_e8 = (undefined1  [8])(psVar19->_M_dataplus)._M_p;
      uStack_e0 = (undefined4)plVar18[3];
      uStack_dc = *(undefined4 *)((long)plVar18 + 0x1c);
      local_f8._M_allocated_capacity = (size_type)(string *)local_e8;
    }
    else {
      local_e8 = (undefined1  [8])(psVar19->_M_dataplus)._M_p;
      local_f8._M_allocated_capacity = (size_type)(string *)*plVar18;
    }
    local_f8._8_8_ = plVar18[1];
    *plVar18 = (long)psVar19;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Sample Method","");
    pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](local_100,&local_70);
    ::std::__cxx11::string::operator=((string *)pbVar10,(string *)local_f8._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    __return_storage_ptr__ = local_100;
    if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity);
    }
    if ((TableFunction *)local_120._0_8_ != (TableFunction *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((this->extra_info).file_filters._M_string_length != 0) {
    local_f8._M_allocated_capacity = (size_type)local_e8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"File Filters","");
    pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](__return_storage_ptr__,(string *)&local_f8);
    ::std::__cxx11::string::_M_assign((string *)pbVar10);
    if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity);
    }
    if (((this->extra_info).filtered_files.index != 0xffffffffffffffff) &&
       ((this->extra_info).total_files.index != 0xffffffffffffffff)) {
      local_90._0_8_ = local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"%llu/%llu","");
      psVar19 = (string *)optional_idx::GetIndex(&(this->extra_info).filtered_files);
      params = optional_idx::GetIndex(&(this->extra_info).total_files);
      Exception::ConstructMessage<unsigned_long,unsigned_long>
                ((string *)&local_f8,&local_90,psVar19,params,in_R8);
      local_120._0_8_ = (TableFunction *)(local_120 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"Scanning Files","");
      pbVar10 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[](local_100,(string *)local_120);
      ::std::__cxx11::string::operator=((string *)pbVar10,(string *)local_f8._M_local_buf);
      if ((TableFunction *)local_120._0_8_ != (TableFunction *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_);
      }
      if ((string *)local_f8._M_allocated_capacity != (string *)local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity);
      }
      __return_storage_ptr__ = local_100;
      if ((undefined1 *)local_90._0_8_ != local_80) {
        operator_delete((void *)local_90._0_8_);
        __return_storage_ptr__ = local_100;
      }
    }
  }
  PhysicalOperator::SetEstimatedCardinality
            (__return_storage_ptr__,(this->super_PhysicalOperator).estimated_cardinality);
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> PhysicalTableScan::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;
	if (function.to_string) {
		TableFunctionToStringInput input(function, bind_data.get());
		auto to_string_result = function.to_string(input);
		for (const auto &it : to_string_result) {
			result[it.first] = it.second;
		}
	} else {
		result["Function"] = StringUtil::Upper(function.name);
	}
	if (function.projection_pushdown) {
		string projections;
		idx_t projected_column_count = function.filter_prune ? projection_ids.size() : column_ids.size();
		for (idx_t i = 0; i < projected_column_count; i++) {
			auto base_index = function.filter_prune ? projection_ids[i] : i;
			auto &column_index = column_ids[base_index];
			auto column_id = column_index.GetPrimaryIndex();
			if (column_id >= names.size()) {
				continue;
			}
			AddProjectionNames(column_index, names[column_id], returned_types[column_id], projections);
		}
		result["Projections"] = projections;
	}
	if (function.filter_pushdown && table_filters) {
		string filters_info;
		bool first_item = true;
		for (auto &f : table_filters->filters) {
			auto &column_index = f.first;
			auto &filter = f.second;
			if (column_index < names.size()) {
				if (!first_item) {
					filters_info += "\n";
				}
				first_item = false;

				const auto col_id = column_ids[column_index].GetPrimaryIndex();
				if (IsVirtualColumn(col_id)) {
					auto entry = virtual_columns.find(col_id);
					if (entry == virtual_columns.end()) {
						throw InternalException("Virtual column not found");
					}
					filters_info += filter->ToString(entry->second.name);
				} else {
					filters_info += filter->ToString(names[col_id]);
				}
			}
		}
		result["Filters"] = filters_info;
	}
	if (extra_info.sample_options) {
		result["Sample Method"] = "System: " + extra_info.sample_options->sample_size.ToString() + "%";
	}
	if (!extra_info.file_filters.empty()) {
		result["File Filters"] = extra_info.file_filters;
		if (extra_info.filtered_files.IsValid() && extra_info.total_files.IsValid()) {
			result["Scanning Files"] = StringUtil::Format("%llu/%llu", extra_info.filtered_files.GetIndex(),
			                                              extra_info.total_files.GetIndex());
		}
	}

	SetEstimatedCardinality(result, estimated_cardinality);
	return result;
}